

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

void ztast_destroy_statements(ztast_t *ast,ztast_statement_t *statements)

{
  undefined8 *puVar1;
  undefined8 *in_RSI;
  ztast_expr_t *in_RDI;
  ztast_t *unaff_retaddr;
  ztast_statement_t *next;
  ztast_statement_t *st;
  undefined8 *local_18;
  
  puVar1 = in_RSI;
  if (in_RSI != (undefined8 *)0x0) {
    while (local_18 = puVar1, local_18 != (undefined8 *)0x0) {
      if (*(int *)(local_18 + 1) == 0) {
        ztast_destroy_expr(unaff_retaddr,in_RDI);
        if (*(long *)(in_RDI + 1) != 0) {
          (**(code **)(in_RDI + 1))(*(undefined8 *)local_18[2],in_RDI[1].data.value);
        }
        if (*(long *)(in_RDI + 1) != 0) {
          (**(code **)(in_RDI + 1))(local_18[2],in_RDI[1].data.value);
        }
      }
      puVar1 = (undefined8 *)*local_18;
      if (*(long *)(in_RDI + 1) != 0) {
        (**(code **)(in_RDI + 1))(local_18,in_RDI[1].data.value);
      }
    }
  }
  return;
}

Assistant:

static void ztast_destroy_statements(ztast_t           *ast,
                                     ztast_statement_t *statements)
{
  ztast_statement_t *st;
  ztast_statement_t *next;

  if (statements == NULL)
    return; /* no statements */

  for (st = statements; st != NULL; st = next)
  {
    switch (st->type)
    {
    case ZTSTMT_ASSIGNMENT:
      ztast_destroy_expr(ast, st->u.assignment->expr);
      ZTAST_FREE(st->u.assignment->id);
      ZTAST_FREE(st->u.assignment);
      break;

    default:
      assert(0);
      break;
    }
    next = st->next;
    ZTAST_FREE(st);
  }
}